

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void saveToFile(string *str,string *filename)

{
  char cVar1;
  ofstream out;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  long local_210;
  filebuf local_208 [240];
  ios_base local_118 [264];
  
  std::operator+(&local_230,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JohnDTill[P]Poifect/",
                 filename);
  std::ofstream::ofstream(&local_210,(string *)&local_230,_S_out);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_210,(str->_M_dataplus)._M_p,str->_M_string_length);
    local_210 = _VTT;
    *(undefined8 *)(local_208 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
    std::filebuf::~filebuf(local_208);
    std::ios_base::~ios_base(local_118);
    return;
  }
  __assert_fail("out.is_open()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JohnDTill[P]Poifect/main.cpp"
                ,0x111,"void saveToFile(const std::string &, const std::string &)");
}

Assistant:

void saveToFile(const std::string& str, const std::string& filename){
    std::ofstream out(SRC"/" +filename);
    assert(out.is_open());
    out << str;
}